

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O2

void tcu::anon_unknown_0::EtcDecompressInternal::decompressETC2Block
               (deUint8 *dst,deUint64 src,deUint8 *alphaDst,bool alphaMode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  undefined1 uVar5;
  deUint8 dVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  deUint8 *pdVar11;
  char cVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  deUint8 *pdVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  int x;
  long lVar23;
  uint uVar24;
  byte bVar25;
  byte bVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  byte bVar30;
  int iVar31;
  int iVar32;
  bool bVar33;
  bool bVar34;
  byte local_78 [4];
  byte local_74 [4];
  undefined4 local_70;
  uint local_6c;
  byte local_66 [6];
  ulong local_60;
  ulong local_58;
  deUint8 *local_50;
  deUint32 table [2];
  
  local_50 = alphaDst;
  uVar16 = (uint)(src >> 0x20);
  uVar24 = uVar16 >> 0x13 & 0x1f;
  local_58 = src >> 0x2b;
  uVar27 = uVar16 >> 0xb & 0x1f;
  local_60 = src >> 0x38;
  bVar3 = (byte)(src >> 0x38);
  uVar20 = bVar3 & 7;
  bVar13 = (byte)(src >> 0x30);
  bVar30 = (char)(bVar13 << 5) >> 7 & 0xf8U | bVar13 & 7;
  bVar26 = (byte)(src >> 0x28);
  bVar25 = (char)(bVar26 << 5) >> 7 & 0xf8U | bVar26 & 7;
  cVar12 = ((uVar20 < 4) << 3 | (byte)uVar20) - 8;
  bVar33 = (src >> 0x21 & 1) != 0;
  if (bVar33 || alphaMode) {
    if ((int)cVar12 + (uVar16 >> 0x1b) < 0x20) {
      if ((int)(char)bVar30 + uVar24 < 0x20) {
        if (0x1f < (int)(char)bVar25 + uVar27) {
          bVar2 = (bVar3 >> 1 & 0x30) >> 4 | (bVar3 >> 1) << 2;
          bVar26 = (byte)(src >> 0x21);
          uVar22 = src >> 0x19 & 0x7f;
          bVar25 = (byte)(src >> 0x13);
          bVar30 = (byte)(src >> 0xd);
          bVar1 = (byte)(src >> 6);
          pdVar11 = dst + 2;
          bVar13 = ((byte)(src >> 0x2b) & 3) << 3 | (bVar13 & 1) << 5;
          bVar13 = ((byte)(src >> 0x27) & 7 | bVar13) << 2 | bVar13 >> 4;
          iVar7 = (uint)bVar13 * 4 + 2;
          bVar3 = bVar3 << 7 | ((byte)(src >> 0x31) & 0x3f) * '\x02' | bVar3 & 1;
          iVar31 = (uint)bVar3 * 4 + 2;
          iVar14 = (uint)bVar2 * 4 + 2;
          for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
            pdVar18 = pdVar11;
            iVar4 = iVar7;
            iVar32 = iVar31;
            iVar15 = iVar14;
            for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
              iVar28 = iVar15 >> 2;
              iVar21 = iVar32 >> 2;
              iVar8 = iVar4 >> 2;
              if (0xfe < iVar28) {
                iVar28 = 0xff;
              }
              dVar6 = (deUint8)iVar28;
              if (iVar28 < 1) {
                dVar6 = '\0';
              }
              pdVar18[-2] = dVar6;
              if (0xfe < iVar21) {
                iVar21 = 0xff;
              }
              dVar6 = (deUint8)iVar21;
              if (iVar21 < 1) {
                dVar6 = '\0';
              }
              pdVar18[-1] = dVar6;
              if (0xfe < iVar8) {
                iVar8 = 0xff;
              }
              dVar6 = (deUint8)iVar8;
              if (iVar8 < 1) {
                dVar6 = '\0';
              }
              *pdVar18 = dVar6;
              if (alphaMode) {
                local_50[lVar23] = 0xff;
              }
              pdVar18 = pdVar18 + 3;
              iVar4 = iVar4 + ((uint)(byte)((bVar25 & 0x30) >> 4 | bVar25 << 2) - (uint)bVar13);
              iVar32 = iVar32 + ((uint)(byte)((byte)(uVar22 >> 6) | (char)uVar22 * '\x02') -
                                (uint)bVar3);
              iVar15 = iVar15 + ((uint)(byte)(((byte)(src >> 0x20) & 1) << 2 |
                                             (bVar26 & 0x3e) * '\x04' + ((bVar26 & 0x30) >> 4)) -
                                (uint)bVar2);
            }
            local_50 = local_50 + 4;
            pdVar11 = pdVar11 + 0xc;
            iVar7 = iVar7 + ((uint)(byte)(((byte)src & 0x30) >> 4 | (byte)src << 2) - (uint)bVar13);
            iVar31 = iVar31 + ((uint)(byte)((bVar1 & 0x40) >> 6 | bVar1 * '\x02') - (uint)bVar3);
            iVar14 = iVar14 + ((uint)(byte)((bVar30 & 0x30) >> 4 | bVar30 << 2) - (uint)bVar2);
          }
          return;
        }
        goto LAB_015faaa4;
      }
      uVar24 = uVar16 >> 0x1b & 0xf;
      uVar27 = uVar16 >> 0xb & 0xf;
      uVar17 = uVar16 >> 7 & 0xf;
      iVar32 = uVar24 * 0x11;
      iVar7 = (uVar16 >> 0x14 & 1) + uVar20 * 2;
      iVar15 = iVar7 * 0x11;
      uVar29 = ((uVar16 >> 0xf & 7) + (uVar16 >> 0x13 & 1) * 8) * 0x11;
      iVar4 = uVar27 * 0x11;
      iVar31 = uVar17 * 0x11;
      uVar20 = (uVar16 >> 3 & 0xf) * 0x11;
      iVar14 = decompressETC2Block::distTable
               [(uint)((uVar17 * 0x1100 | uVar27 * 0x110000 | uVar20) <=
                      (iVar7 * 0x1100 | uVar24 * 0x110000 | uVar29)) |
                (uint)(src >> 0x1f) & 2 | uVar16 & 4];
      iVar7 = iVar14 + iVar32;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      bVar13 = 0;
      bVar3 = (byte)iVar7;
      if (iVar7 < 1) {
        bVar3 = bVar13;
      }
      iVar7 = iVar14 + iVar15;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      local_74[0] = (byte)iVar7;
      if (iVar7 < 1) {
        local_74[0] = bVar13;
      }
      iVar7 = iVar14 + uVar29;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      local_78[0] = (byte)iVar7;
      if (iVar7 < 1) {
        local_78[0] = bVar13;
      }
      iVar32 = iVar32 - iVar14;
      if (0xfe < iVar32) {
        iVar32 = 0xff;
      }
      bVar26 = (byte)iVar32;
      if (iVar32 < 1) {
        bVar26 = bVar13;
      }
      local_70._0_2_ = CONCAT11(bVar26,bVar3);
      iVar15 = iVar15 - iVar14;
      if (0xfe < iVar15) {
        iVar15 = 0xff;
      }
      local_74[1] = (byte)iVar15;
      if (iVar15 < 1) {
        local_74[1] = bVar13;
      }
      iVar7 = uVar29 - iVar14;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      local_78[1] = (byte)iVar7;
      if (iVar7 < 1) {
        local_78[1] = bVar13;
      }
      iVar7 = iVar14 + iVar4;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      bVar3 = (byte)iVar7;
      if (iVar7 < 1) {
        bVar3 = bVar13;
      }
      iVar7 = iVar14 + iVar31;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      local_74[2] = (byte)iVar7;
      if (iVar7 < 1) {
        local_74[2] = bVar13;
      }
      iVar7 = iVar14 + uVar20;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      local_78[2] = (byte)iVar7;
      if (iVar7 < 1) {
        local_78[2] = bVar13;
      }
      iVar4 = iVar4 - iVar14;
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      bVar26 = (byte)iVar4;
      if (iVar4 < 1) {
        bVar26 = bVar13;
      }
      local_70 = CONCAT13(bVar26,CONCAT12(bVar3,(undefined2)local_70));
      iVar31 = iVar31 - iVar14;
      if (0xfe < iVar31) {
        iVar31 = 0xff;
      }
      if (iVar31 < 1) {
        iVar31 = 0;
      }
      local_74[3] = (byte)iVar31;
      uVar20 = uVar20 - iVar14;
    }
    else {
      iVar14 = decompressETC2Block::distTable[uVar16 & 1 | uVar16 >> 1 & 6];
      local_74[0] = ((byte)(src >> 0x34) & 0xf) * '\x11';
      local_78[0] = (bVar13 & 0xf) * '\x11';
      bVar13 = ((byte)(src >> 0x2c) & 0xf) * '\x11';
      local_74[2] = (bVar26 & 0xf) * '\x11';
      local_78[2] = ((byte)(src >> 0x24) & 0xf) * '\x11';
      iVar7 = iVar14 + (uint)bVar13;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      local_70._0_2_ = CONCAT11((char)iVar7,((bVar3 & 3) + (bVar3 >> 3 & 3) * '\x04') * '\x11');
      iVar7 = iVar14 + (uint)local_74[2];
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      local_74[1] = (byte)iVar7;
      if (iVar7 < 1) {
        local_74[1] = 0;
      }
      iVar7 = iVar14 + (uint)local_78[2];
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      local_78[1] = (byte)iVar7;
      if (iVar7 < 1) {
        local_78[1] = 0;
      }
      iVar7 = (uint)bVar13 - iVar14;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      uVar5 = (undefined1)iVar7;
      if (iVar7 < 1) {
        uVar5 = 0;
      }
      local_70 = CONCAT13(uVar5,CONCAT12(bVar13,(undefined2)local_70));
      iVar7 = (uint)local_74[2] - iVar14;
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      local_74[3] = (byte)iVar7;
      uVar20 = (uint)local_78[2] - iVar14;
    }
    uVar16 = 0xff;
    if ((int)uVar20 < 0xff) {
      uVar16 = uVar20;
    }
    uVar20 = 0;
    if ((int)uVar16 < 1) {
      uVar16 = uVar20;
    }
    local_78[3] = (char)uVar16;
    for (uVar22 = 0; uVar22 != 0x10; uVar22 = uVar22 + 1) {
      uVar19 = (ulong)(uVar20 & 0xc | (uint)(uVar22 >> 2) & 0x3fffffff);
      lVar9 = uVar19 * 3;
      uVar16 = (uint)((src >> (uVar22 & 0x3f) & 1) != 0) +
               ((uint)(src >> ((char)uVar22 + 0x10U & 0x3f)) & 1) * 2;
      if (uVar16 == 2 && ((src >> 0x21 & 1) == 0 && alphaMode)) {
        (dst + lVar9)[0] = '\0';
        (dst + lVar9)[1] = '\0';
        dst[lVar9 + 2] = '\0';
        dVar6 = '\0';
LAB_015fb252:
        alphaDst[uVar19] = dVar6;
      }
      else {
        uVar10 = (ulong)uVar16;
        dst[lVar9] = *(deUint8 *)((long)&local_70 + uVar10);
        dst[lVar9 + 1] = local_74[uVar10];
        dst[lVar9 + 2] = local_78[uVar10];
        dVar6 = 0xff;
        if (alphaMode) goto LAB_015fb252;
      }
      uVar20 = uVar20 + 4;
    }
  }
  else {
LAB_015faaa4:
    local_70 = uVar16 >> 5 & 7;
    local_6c = uVar16 >> 2 & 7;
    if (bVar33 || alphaMode) {
      bVar13 = cVar12 + (bVar3 >> 3);
      local_74[0] = bVar3 >> 5 | bVar3 & 0xf8;
      bVar3 = (byte)uVar24;
      bVar30 = bVar30 + bVar3;
      local_78[0] = bVar3 >> 2 | bVar3 * '\b';
      bVar3 = (byte)uVar27;
      bVar25 = bVar25 + bVar3;
      local_66[0] = bVar3 >> 2 | bVar3 * '\b';
      local_74[1] = bVar13 >> 2 | bVar13 * '\b';
      local_78[1] = bVar30 >> 2 | bVar30 * '\b';
      local_66[1] = bVar25 >> 2 | bVar25 * '\b';
    }
    else {
      local_74[0] = (bVar3 >> 4) * '\x11';
      local_74[1] = (bVar3 & 0xf) * '\x11';
      local_78[0] = ((byte)(src >> 0x34) & 0xf) * '\x11';
      local_78[1] = (bVar13 & 0xf) * '\x11';
      local_66[0] = ((byte)(src >> 0x2c) & 0xf) * '\x11';
      local_66[1] = (bVar26 & 0xf) * '\x11';
    }
    bVar33 = (src >> 0x21 & 1) != 0;
    for (uVar22 = 0; uVar22 != 0x10; uVar22 = uVar22 + 1) {
      uVar20 = (uint)(uVar22 >> 2) & 0x3fffffff;
      uVar16 = (uint)uVar22 & 3;
      uVar19 = (ulong)(uVar16 * 4 | uVar20);
      lVar9 = uVar19 * 3;
      if ((src >> 0x20 & 1) == 0) {
        uVar16 = uVar20;
      }
      bVar34 = 1 < uVar16;
      uVar16 = (uint)((src >> (uVar22 & 0x3f) & 1) != 0) +
               ((uint)(src >> ((char)uVar22 + 0x10U & 0x3f)) & 1) * 2;
      if (uVar16 != 2 || (bVar33 || !alphaMode)) {
        if ((bVar33 || !alphaMode) || (iVar7 = 0, (uVar16 & 0xfffffffd) != 0)) {
          iVar7 = decompressETC2Block::modifierTable[(uint)(&local_70)[bVar34]][uVar16];
        }
        iVar14 = (uint)local_74[bVar34] + iVar7;
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        dst[lVar9] = (deUint8)iVar14;
        iVar14 = (uint)local_78[bVar34] + iVar7;
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        dst[lVar9 + 1] = (deUint8)iVar14;
        iVar7 = iVar7 + (uint)local_66[bVar34];
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        dst[lVar9 + 2] = (deUint8)iVar7;
        dVar6 = 0xff;
        if (alphaMode) goto LAB_015fadc4;
      }
      else {
        (dst + lVar9)[0] = '\0';
        (dst + lVar9)[1] = '\0';
        dst[lVar9 + 2] = '\0';
        dVar6 = '\0';
LAB_015fadc4:
        alphaDst[uVar19] = dVar6;
      }
    }
  }
  return;
}

Assistant:

void decompressETC2Block (deUint8 dst[ETC2_UNCOMPRESSED_BLOCK_SIZE_RGB8], deUint64 src, deUint8 alphaDst[ETC2_UNCOMPRESSED_BLOCK_SIZE_A8], bool alphaMode)
{
	enum Etc2Mode
	{
		MODE_INDIVIDUAL = 0,
		MODE_DIFFERENTIAL,
		MODE_T,
		MODE_H,
		MODE_PLANAR,

		MODE_LAST
	};

	const int		diffOpaqueBit	= (int)getBit(src, 33);
	const deInt8	selBR			= (deInt8)getBits(src, 59, 63);	// 5 bits.
	const deInt8	selBG			= (deInt8)getBits(src, 51, 55);
	const deInt8	selBB			= (deInt8)getBits(src, 43, 47);
	const deInt8	selDR			= extendSigned3To8((deUint8)getBits(src, 56, 58)); // 3 bits.
	const deInt8	selDG			= extendSigned3To8((deUint8)getBits(src, 48, 50));
	const deInt8	selDB			= extendSigned3To8((deUint8)getBits(src, 40, 42));
	Etc2Mode		mode;

	if (!alphaMode && diffOpaqueBit == 0)
		mode = MODE_INDIVIDUAL;
	else if (!de::inRange(selBR + selDR, 0, 31))
		mode = MODE_T;
	else if (!de::inRange(selBG + selDG, 0, 31))
		mode = MODE_H;
	else if (!de::inRange(selBB + selDB, 0, 31))
		mode = MODE_PLANAR;
	else
		mode = MODE_DIFFERENTIAL;

	if (mode == MODE_INDIVIDUAL || mode == MODE_DIFFERENTIAL)
	{
		// Individual and differential modes have some steps in common, handle them here.
		static const int modifierTable[8][4] =
		{
		//	  00   01   10    11
			{  2,   8,  -2,   -8 },
			{  5,  17,  -5,  -17 },
			{  9,  29,  -9,  -29 },
			{ 13,  42, -13,  -42 },
			{ 18,  60, -18,  -60 },
			{ 24,  80, -24,  -80 },
			{ 33, 106, -33, -106 },
			{ 47, 183, -47, -183 }
		};

		const int		flipBit		= (int)getBit(src, 32);
		const deUint32	table[2]	= { getBits(src, 37, 39), getBits(src, 34, 36) };
		deUint8			baseR[2];
		deUint8			baseG[2];
		deUint8			baseB[2];

		if (mode == MODE_INDIVIDUAL)
		{
			// Individual mode, initial values.
			baseR[0] = extend4To8((deUint8)getBits(src, 60, 63));
			baseR[1] = extend4To8((deUint8)getBits(src, 56, 59));
			baseG[0] = extend4To8((deUint8)getBits(src, 52, 55));
			baseG[1] = extend4To8((deUint8)getBits(src, 48, 51));
			baseB[0] = extend4To8((deUint8)getBits(src, 44, 47));
			baseB[1] = extend4To8((deUint8)getBits(src, 40, 43));
		}
		else
		{
			// Differential mode, initial values.
			baseR[0] = extend5To8(selBR);
			baseG[0] = extend5To8(selBG);
			baseB[0] = extend5To8(selBB);

			baseR[1] = extend5To8((deUint8)(selBR + selDR));
			baseG[1] = extend5To8((deUint8)(selBG + selDG));
			baseB[1] = extend5To8((deUint8)(selBB + selDB));
		}

		// Write final pixels for individual or differential mode.
		for (int pixelNdx = 0; pixelNdx < ETC2_BLOCK_HEIGHT*ETC2_BLOCK_WIDTH; pixelNdx++)
		{
			const int		x				= pixelNdx / ETC2_BLOCK_HEIGHT;
			const int		y				= pixelNdx % ETC2_BLOCK_HEIGHT;
			const int		dstOffset		= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
			const int		subBlock		= ((flipBit ? y : x) >= 2) ? 1 : 0;
			const deUint32	tableNdx		= table[subBlock];
			const deUint32	modifierNdx		= (getBit(src, 16+pixelNdx) << 1) | getBit(src, pixelNdx);
			const int		alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

			// If doing PUNCHTHROUGH version (alphaMode), opaque bit may affect colors.
			if (alphaMode && diffOpaqueBit == 0 && modifierNdx == 2)
			{
				dst[dstOffset+0]			= 0;
				dst[dstOffset+1]			= 0;
				dst[dstOffset+2]			= 0;
				alphaDst[alphaDstOffset]	= 0;
			}
			else
			{
				int modifier;

				// PUNCHTHROUGH version and opaque bit may also affect modifiers.
				if (alphaMode && diffOpaqueBit == 0 && (modifierNdx == 0 || modifierNdx == 2))
					modifier = 0;
				else
					modifier = modifierTable[tableNdx][modifierNdx];

				dst[dstOffset+0] = (deUint8)deClamp32((int)baseR[subBlock] + modifier, 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32((int)baseG[subBlock] + modifier, 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32((int)baseB[subBlock] + modifier, 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
	else if (mode == MODE_T || mode == MODE_H)
	{
		// T and H modes have some steps in common, handle them here.
		static const int distTable[8] = { 3, 6, 11, 16, 23, 32, 41, 64 };

		deUint8 paintR[4];
		deUint8 paintG[4];
		deUint8 paintB[4];

		if (mode == MODE_T)
		{
			// T mode, calculate paint values.
			const deUint8	R1a			= (deUint8)getBits(src, 59, 60);
			const deUint8	R1b			= (deUint8)getBits(src, 56, 57);
			const deUint8	G1			= (deUint8)getBits(src, 52, 55);
			const deUint8	B1			= (deUint8)getBits(src, 48, 51);
			const deUint8	R2			= (deUint8)getBits(src, 44, 47);
			const deUint8	G2			= (deUint8)getBits(src, 40, 43);
			const deUint8	B2			= (deUint8)getBits(src, 36, 39);
			const deUint32	distNdx		= (getBits(src, 34, 35) << 1) | getBit(src, 32);
			const int		dist		= distTable[distNdx];

			paintR[0] = extend4To8((deUint8)((R1a << 2) | R1b));
			paintG[0] = extend4To8(G1);
			paintB[0] = extend4To8(B1);
			paintR[2] = extend4To8(R2);
			paintG[2] = extend4To8(G2);
			paintB[2] = extend4To8(B2);
			paintR[1] = (deUint8)deClamp32((int)paintR[2] + dist, 0, 255);
			paintG[1] = (deUint8)deClamp32((int)paintG[2] + dist, 0, 255);
			paintB[1] = (deUint8)deClamp32((int)paintB[2] + dist, 0, 255);
			paintR[3] = (deUint8)deClamp32((int)paintR[2] - dist, 0, 255);
			paintG[3] = (deUint8)deClamp32((int)paintG[2] - dist, 0, 255);
			paintB[3] = (deUint8)deClamp32((int)paintB[2] - dist, 0, 255);
		}
		else
		{
			// H mode, calculate paint values.
			const deUint8	R1		= (deUint8)getBits(src, 59, 62);
			const deUint8	G1a		= (deUint8)getBits(src, 56, 58);
			const deUint8	G1b		= (deUint8)getBit(src, 52);
			const deUint8	B1a		= (deUint8)getBit(src, 51);
			const deUint8	B1b		= (deUint8)getBits(src, 47, 49);
			const deUint8	R2		= (deUint8)getBits(src, 43, 46);
			const deUint8	G2		= (deUint8)getBits(src, 39, 42);
			const deUint8	B2		= (deUint8)getBits(src, 35, 38);
			deUint8			baseR[2];
			deUint8			baseG[2];
			deUint8			baseB[2];
			deUint32		baseValue[2];
			deUint32		distNdx;
			int				dist;

			baseR[0]		= extend4To8(R1);
			baseG[0]		= extend4To8((deUint8)((G1a << 1) | G1b));
			baseB[0]		= extend4To8((deUint8)((B1a << 3) | B1b));
			baseR[1]		= extend4To8(R2);
			baseG[1]		= extend4To8(G2);
			baseB[1]		= extend4To8(B2);
			baseValue[0]	= (((deUint32)baseR[0]) << 16) | (((deUint32)baseG[0]) << 8) | baseB[0];
			baseValue[1]	= (((deUint32)baseR[1]) << 16) | (((deUint32)baseG[1]) << 8) | baseB[1];
			distNdx			= (getBit(src, 34) << 2) | (getBit(src, 32) << 1) | (deUint32)(baseValue[0] >= baseValue[1]);
			dist			= distTable[distNdx];

			paintR[0]		= (deUint8)deClamp32((int)baseR[0] + dist, 0, 255);
			paintG[0]		= (deUint8)deClamp32((int)baseG[0] + dist, 0, 255);
			paintB[0]		= (deUint8)deClamp32((int)baseB[0] + dist, 0, 255);
			paintR[1]		= (deUint8)deClamp32((int)baseR[0] - dist, 0, 255);
			paintG[1]		= (deUint8)deClamp32((int)baseG[0] - dist, 0, 255);
			paintB[1]		= (deUint8)deClamp32((int)baseB[0] - dist, 0, 255);
			paintR[2]		= (deUint8)deClamp32((int)baseR[1] + dist, 0, 255);
			paintG[2]		= (deUint8)deClamp32((int)baseG[1] + dist, 0, 255);
			paintB[2]		= (deUint8)deClamp32((int)baseB[1] + dist, 0, 255);
			paintR[3]		= (deUint8)deClamp32((int)baseR[1] - dist, 0, 255);
			paintG[3]		= (deUint8)deClamp32((int)baseG[1] - dist, 0, 255);
			paintB[3]		= (deUint8)deClamp32((int)baseB[1] - dist, 0, 255);
		}

		// Write final pixels for T or H mode.
		for (int pixelNdx = 0; pixelNdx < ETC2_BLOCK_HEIGHT*ETC2_BLOCK_WIDTH; pixelNdx++)
		{
			const int		x				= pixelNdx / ETC2_BLOCK_HEIGHT;
			const int		y				= pixelNdx % ETC2_BLOCK_HEIGHT;
			const int		dstOffset		= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
			const deUint32	paintNdx		= (getBit(src, 16+pixelNdx) << 1) | getBit(src, pixelNdx);
			const int		alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

			if (alphaMode && diffOpaqueBit == 0 && paintNdx == 2)
			{
				dst[dstOffset+0]			= 0;
				dst[dstOffset+1]			= 0;
				dst[dstOffset+2]			= 0;
				alphaDst[alphaDstOffset]	= 0;
			}
			else
			{
				dst[dstOffset+0] = (deUint8)deClamp32((int)paintR[paintNdx], 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32((int)paintG[paintNdx], 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32((int)paintB[paintNdx], 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
	else
	{
		// Planar mode.
		const deUint8 GO1	= (deUint8)getBit(src, 56);
		const deUint8 GO2	= (deUint8)getBits(src, 49, 54);
		const deUint8 BO1	= (deUint8)getBit(src, 48);
		const deUint8 BO2	= (deUint8)getBits(src, 43, 44);
		const deUint8 BO3	= (deUint8)getBits(src, 39, 41);
		const deUint8 RH1	= (deUint8)getBits(src, 34, 38);
		const deUint8 RH2	= (deUint8)getBit(src, 32);
		const deUint8 RO	= extend6To8((deUint8)getBits(src, 57, 62));
		const deUint8 GO	= extend7To8((deUint8)((GO1 << 6) | GO2));
		const deUint8 BO	= extend6To8((deUint8)((BO1 << 5) | (BO2 << 3) | BO3));
		const deUint8 RH	= extend6To8((deUint8)((RH1 << 1) | RH2));
		const deUint8 GH	= extend7To8((deUint8)getBits(src, 25, 31));
		const deUint8 BH	= extend6To8((deUint8)getBits(src, 19, 24));
		const deUint8 RV	= extend6To8((deUint8)getBits(src, 13, 18));
		const deUint8 GV	= extend7To8((deUint8)getBits(src, 6, 12));
		const deUint8 BV	= extend6To8((deUint8)getBits(src, 0, 5));

		// Write final pixels for planar mode.
		for (int y = 0; y < 4; y++)
		{
			for (int x = 0; x < 4; x++)
			{
				const int dstOffset			= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
				const int unclampedR		= (x * ((int)RH-(int)RO) + y * ((int)RV-(int)RO) + 4*(int)RO + 2) >> 2;
				const int unclampedG		= (x * ((int)GH-(int)GO) + y * ((int)GV-(int)GO) + 4*(int)GO + 2) >> 2;
				const int unclampedB		= (x * ((int)BH-(int)BO) + y * ((int)BV-(int)BO) + 4*(int)BO + 2) >> 2;
				const int alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

				dst[dstOffset+0] = (deUint8)deClamp32(unclampedR, 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32(unclampedG, 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32(unclampedB, 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
}